

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O0

plutovg_surface_t * plutovg_surface_load_from_image_base64(char *data,int length)

{
  byte bVar1;
  size_t sVar2;
  void *data_00;
  ulong uVar3;
  int local_54;
  uint8_t cc;
  ulong uStack_50;
  int i;
  size_t didx;
  size_t sidx;
  size_t equals_sign_count;
  size_t output_length;
  uint8_t *output_data;
  plutovg_surface_t *surface;
  int length_local;
  char *data_local;
  
  output_data = (uint8_t *)0x0;
  equals_sign_count = 0;
  sidx = 0;
  didx = 0;
  uStack_50 = 0;
  surface._4_4_ = length;
  if (length == -1) {
    sVar2 = strlen(data);
    surface._4_4_ = (int)sVar2;
  }
  data_00 = malloc((long)surface._4_4_);
  if (data_00 == (void *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    for (local_54 = 0; local_54 < surface._4_4_; local_54 = local_54 + 1) {
      bVar1 = data[local_54];
      if (bVar1 == 0x3d) {
        sidx = sidx + 1;
      }
      else if (((((bVar1 == 0x2b) || (bVar1 == 0x2f)) || ((0x60 < bVar1 && (bVar1 < 0x7b)))) ||
               ((0x40 < bVar1 && (bVar1 < 0x5b)))) || ((0x2f < bVar1 && (bVar1 < 0x3a)))) {
        if (sidx != 0) goto LAB_001655ed;
        *(uint8_t *)((long)data_00 + equals_sign_count) = ""[bVar1];
        equals_sign_count = equals_sign_count + 1;
      }
      else if ((((bVar1 != 0x20) && (bVar1 != 9)) && (bVar1 != 10)) && (bVar1 != 0xd))
      goto LAB_001655ed;
    }
    if (((equals_sign_count != 0) && (sidx < 3)) &&
       (((equals_sign_count & 3) != 1 &&
        (uVar3 = equals_sign_count - (equals_sign_count + 3 >> 2), uVar3 != 0)))) {
      if (1 < uVar3) {
        for (; uStack_50 < uVar3 - 2; uStack_50 = uStack_50 + 3) {
          *(byte *)((long)data_00 + uStack_50) =
               *(char *)((long)data_00 + didx) << 2 |
               (byte)((int)(uint)*(byte *)((long)data_00 + didx + 1) >> 4) & 3;
          *(byte *)((long)data_00 + uStack_50 + 1) =
               *(char *)((long)data_00 + didx + 1) << 4 |
               (byte)((int)(uint)*(byte *)((long)data_00 + didx + 2) >> 2) & 0xf;
          *(byte *)((long)data_00 + uStack_50 + 2) =
               *(char *)((long)data_00 + didx + 2) << 6 | *(byte *)((long)data_00 + didx + 3) & 0x3f
          ;
          didx = didx + 4;
        }
      }
      if (uStack_50 < uVar3) {
        *(byte *)((long)data_00 + uStack_50) =
             *(char *)((long)data_00 + didx) << 2 |
             (byte)((int)(uint)*(byte *)((long)data_00 + didx + 1) >> 4) & 3;
      }
      if (uStack_50 + 1 < uVar3) {
        *(byte *)((long)data_00 + uStack_50 + 1) =
             *(char *)((long)data_00 + didx + 1) << 4 |
             (byte)((int)(uint)*(byte *)((long)data_00 + didx + 2) >> 2) & 0xf;
      }
      output_data = (uint8_t *)plutovg_surface_load_from_image_data(data_00,(int)uVar3);
    }
LAB_001655ed:
    free(data_00);
    data_local = (char *)output_data;
  }
  return (plutovg_surface_t *)data_local;
}

Assistant:

plutovg_surface_t* plutovg_surface_load_from_image_base64(const char* data, int length)
{
    plutovg_surface_t* surface = NULL;
    uint8_t* output_data = NULL;
    size_t output_length = 0;

    size_t equals_sign_count = 0;
    size_t sidx = 0;
    size_t didx = 0;

    if(length == -1)
        length = strlen(data);
    output_data = malloc(length);
    if(output_data == NULL)
        return NULL;
    for(int i = 0; i < length; ++i) {
        uint8_t cc = data[i];
        if(cc == '=') {
            ++equals_sign_count;
        } else if(cc == '+' || cc == '/' || PLUTOVG_IS_ALNUM(cc)) {
            if(equals_sign_count > 0)
                goto cleanup;
            output_data[output_length++] = base64_table[cc];
        } else if(!PLUTOVG_IS_WS(cc)) {
            goto cleanup;
        }
    }

    if(output_length == 0 || equals_sign_count > 2 || (output_length % 4) == 1)
        goto cleanup;
    output_length -= (output_length + 3) / 4;
    if(output_length == 0) {
        goto cleanup;
    }

    if(output_length > 1) {
        while(didx < output_length - 2) {
            output_data[didx + 0] = (((output_data[sidx + 0] << 2) & 255) | ((output_data[sidx + 1] >> 4) & 003));
            output_data[didx + 1] = (((output_data[sidx + 1] << 4) & 255) | ((output_data[sidx + 2] >> 2) & 017));
            output_data[didx + 2] = (((output_data[sidx + 2] << 6) & 255) | ((output_data[sidx + 3] >> 0) & 077));
            sidx += 4;
            didx += 3;
        }
    }

    if(didx < output_length)
        output_data[didx] = (((output_data[sidx + 0] << 2) & 255) | ((output_data[sidx + 1] >> 4) & 003));
    if(++didx < output_length) {
        output_data[didx] = (((output_data[sidx + 1] << 4) & 255) | ((output_data[sidx + 2] >> 2) & 017));
    }

    surface = plutovg_surface_load_from_image_data(output_data, output_length);
cleanup:
    free(output_data);
    return surface;
}